

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

int __thiscall cimg_library::cimg::system(cimg *this,char *__command)

{
  size_t sVar1;
  char *__dest;
  int out_val;
  char *ncommand;
  char *pcStack_20;
  uint l;
  char *module_name_local;
  char *command_local;
  
  pcStack_20 = __command;
  module_name_local = (char *)this;
  unused<char_const*>(&stack0xffffffffffffffe0);
  sVar1 = strlen(module_name_local);
  if ((int)sVar1 == 0) {
    command_local._4_4_ = -1;
  }
  else {
    __dest = (char *)operator_new__((ulong)((int)sVar1 + 0x10));
    strncpy(__dest,module_name_local,sVar1 & 0xffffffff);
    strcpy(__dest + (sVar1 & 0xffffffff)," 2> /dev/null");
    command_local._4_4_ = ::system(__dest);
    if (__dest != (char *)0x0) {
      operator_delete__(__dest);
    }
  }
  return command_local._4_4_;
}

Assistant:

inline int system(const char *const command, const char *const module_name=0) {
      cimg::unused(module_name);
#ifdef cimg_no_system_calls
      return -1;
#else
#if cimg_OS==1
      const unsigned int l = std::strlen(command);
      if (l) {
        char *const ncommand = new char[l + 16];
        std::strncpy(ncommand,command,l);
        std::strcpy(ncommand + l," 2> /dev/null"); // Make command silent.
        const int out_val = std::system(ncommand);
        delete[] ncommand;
        return out_val;
      } else return -1;
#elif cimg_OS==2
      PROCESS_INFORMATION pi;
      STARTUPINFO si;
      std::memset(&pi,0,sizeof(PROCESS_INFORMATION));
      std::memset(&si,0,sizeof(STARTUPINFO));
      GetStartupInfo(&si);
      si.cb = sizeof(si);
      si.wShowWindow = SW_HIDE;
      si.dwFlags |= SW_HIDE | STARTF_USESHOWWINDOW;
      const BOOL res = CreateProcess((LPCTSTR)module_name,(LPTSTR)command,0,0,FALSE,0,0,0,&si,&pi);
      if (res) {
        WaitForSingleObject(pi.hProcess, INFINITE);
        CloseHandle(pi.hThread);
        CloseHandle(pi.hProcess);
        return 0;
      } else return std::system(command);
#endif
#endif
    }